

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_PiecewiseLinearExprPrecedence_Test::TestBody
          (ExprWriterTest_PiecewiseLinearExprPrecedence_Test *this)

{
  Reference arg;
  PLTermBuilder builder;
  NumericExpr lhs;
  bool bVar1;
  AssertHelper *this_00;
  long in_RDI;
  char *file;
  AssertionResult gtest_ar;
  PLTermBuilder plterm;
  ExprWriterTest *in_stack_fffffffffffffef8;
  BasicExprFactory<std::allocator<char>_> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  BasicExprFactory<std::allocator<char>_> *in_stack_ffffffffffffff10;
  ExprBase other;
  undefined4 uVar2;
  int line;
  Type type;
  AssertHelper *this_01;
  Impl *message;
  AssertHelper *this_02;
  AssertHelper local_58;
  BasicCStringRef<char> local_50;
  string local_48 [32];
  AssertionResult local_28;
  undefined1 local_18 [24];
  
  uVar2 = (undefined4)in_RDI;
  line = (int)((ulong)in_RDI >> 0x20);
  file = (char *)(in_RDI + 0x10);
  local_18._0_16_ =
       (undefined1  [16])
       mp::BasicExprFactory<std::allocator<char>_>::BeginPLTerm
                 (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  other.impl_ = (Impl *)local_18;
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope
            ((PLTermBuilder *)other.impl_,-1.0);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddBreakpoint
            ((PLTermBuilder *)other.impl_,5.0);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope
            ((PLTermBuilder *)other.impl_,0.0);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddBreakpoint
            ((PLTermBuilder *)other.impl_,10.0);
  mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope
            ((PLTermBuilder *)other.impl_,1.0);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_50,"{}");
  message = (Impl *)local_18._0_8_;
  this_02 = (AssertHelper *)local_18._8_8_;
  mp::BasicExprFactory<std::allocator<char>_>::MakeVariable
            ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffef8,0);
  builder.slope_index_ = uVar2;
  builder.impl_ = (Impl *)other.impl_;
  builder.breakpoint_index_ = line;
  arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._4_4_ =
       in_stack_ffffffffffffff0c;
  arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._0_4_ =
       in_stack_ffffffffffffff08;
  mp::BasicExprFactory<std::allocator<char>_>::EndPLTerm(in_stack_ffffffffffffff00,builder,arg);
  type = kSuccess;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::PLTerm>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),(PLTerm)other.impl_,
             (type)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  ExprWriterTest::MakeConst(in_stack_fffffffffffffef8,5.95096141628031e-318);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (NumericConstant)other.impl_,(type)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  lhs.super_ExprBase.impl_._4_4_ = line;
  lhs.super_ExprBase.impl_._0_4_ = uVar2;
  mp::BasicExprFactory<std::allocator<char>_>::MakeBinary
            ((BasicExprFactory<std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (Kind)((ulong)in_stack_ffffffffffffff00 >> 0x20),lhs,(NumericExpr)other.impl_);
  this_01 = &local_58;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
              )other.impl_,(type)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((CStringRef)local_48,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)this_01);
  testing::internal::EqHelper<false>::Compare<char[28],std::__cxx11::string>
            ((char *)CONCAT44(line,uVar2),(char *)other.impl_,
             (char (*) [28])CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff00);
  std::__cxx11::string::~string(local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x126225)
    ;
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,line,(char *)other.impl_);
    testing::internal::AssertHelper::operator=(this_02,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x126273);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1262b6);
  return;
}

Assistant:

TEST_F(ExprWriterTest, PiecewiseLinearExprPrecedence) {
  auto plterm = BeginPLTerm(2);
  plterm.AddSlope(-1);
  plterm.AddBreakpoint(5);
  plterm.AddSlope(0);
  plterm.AddBreakpoint(10);
  plterm.AddSlope(1);
  CHECK_WRITE("<<5, 10; -1, 0, 1>> x43 ^ 2",
      MakeBinary(ex::POW, EndPLTerm(plterm, MakeVariable(42)), MakeConst(2)));
}